

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZWavyLine.cpp
# Opt level: O1

void pzgeom::TPZWavyLine::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  TPZAdmChunkVector<TPZGeoNode,_10> *this;
  ulong uVar1;
  double *pdVar2;
  int iVar3;
  TPZGeoNode *pTVar4;
  TPZGeoElRefPattern<pzgeom::TPZWavyLine> *this_00;
  ulong uVar5;
  TPZManVector<double,_3> wavedir;
  TPZManVector<long,_10> nodind;
  TPZManVector<double,_3> local_148;
  TPZManVector<double,_3> local_110;
  TPZManVector<double,_3> local_d8;
  TPZManVector<long,_10> local_a0;
  
  local_110.super_TPZVec<double>.fStore = (double *)0x0;
  local_110.super_TPZVec<double>.fNElements = 0;
  local_110.super_TPZVec<double>.fNAlloc = 0;
  local_110.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841aa0;
  uVar1 = lowercorner->fNElements;
  if ((long)uVar1 < 4) {
    local_110.super_TPZVec<double>.fStore = local_110.fExtAlloc;
    local_110.super_TPZVec<double>.fNAlloc = 0;
  }
  else {
    local_110.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    local_110.super_TPZVec<double>.fNAlloc = uVar1;
  }
  if (0 < (long)uVar1) {
    pdVar2 = lowercorner->fStore;
    uVar5 = 0;
    do {
      local_110.super_TPZVec<double>.fStore[uVar5] = pdVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  local_148.super_TPZVec<double>.fStore = (double *)0x0;
  local_148.super_TPZVec<double>.fNElements = 0;
  local_148.super_TPZVec<double>.fNAlloc = 0;
  local_148.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841aa0;
  local_110.super_TPZVec<double>.fNElements = uVar1;
  if ((long)uVar1 < 4) {
    local_148.super_TPZVec<double>.fStore = local_148.fExtAlloc;
    local_148.super_TPZVec<double>.fNAlloc = 0;
  }
  else {
    local_148.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    local_148.super_TPZVec<double>.fNAlloc = uVar1;
  }
  if (0 < (long)uVar1) {
    pdVar2 = lowercorner->fStore;
    uVar5 = 0;
    do {
      local_148.super_TPZVec<double>.fStore[uVar5] = pdVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  local_a0.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x0;
  local_148.super_TPZVec<double>.fNElements = uVar1;
  TPZManVector<double,_3>::TPZManVector(&local_d8,3,(double *)&local_a0);
  *local_148.super_TPZVec<double>.fStore = *local_110.super_TPZVec<double>.fStore + 2.0;
  local_d8.super_TPZVec<double>.fStore[1] = 1.0;
  TPZManVector<long,_10>::TPZManVector(&local_a0,2);
  this = &gmesh->fNodeVec;
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  *local_a0.super_TPZVec<long>.fStore = (long)iVar3;
  pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
  TPZGeoNode::Initialize(pTVar4,&local_110.super_TPZVec<double>,gmesh);
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  local_a0.super_TPZVec<long>.fStore[1] = (long)iVar3;
  pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
  TPZGeoNode::Initialize(pTVar4,&local_148.super_TPZVec<double>,gmesh);
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZWavyLine> *)operator_new(0x108);
  TPZGeoElRefPattern<pzgeom::TPZWavyLine>::TPZGeoElRefPattern
            (this_00,&local_a0.super_TPZVec<long>,matid,gmesh);
  pdVar2 = size->fStore;
  *pdVar2 = 2.0;
  pdVar2[1] = 2.0;
  SetData(&(this_00->super_TPZGeoElRefLess<pzgeom::TPZWavyLine>).fGeo,&local_d8.super_TPZVec<double>
          ,4);
  TPZManVector<long,_10>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_d8);
  TPZManVector<double,_3>::~TPZManVector(&local_148);
  TPZManVector<double,_3>::~TPZManVector(&local_110);
  return;
}

Assistant:

void TPZWavyLine::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        TPZManVector<REAL,3> x0(lowercorner), x1(lowercorner), wavedir(3,0.);
        x1[0] = x0[0]+2.;
        wavedir[1] = 1.;
        int numwaves = 4;
        TPZManVector<int64_t> nodind(2);
        nodind[0] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodind[0]].Initialize(x0, gmesh);
        nodind[1] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodind[1]].Initialize(x1, gmesh);
        
        TPZGeoElRefPattern<TPZWavyLine> *gel = new TPZGeoElRefPattern<TPZWavyLine> (nodind,matid,gmesh);
        size[0] = 2.;
        size[1] = 2.;
        gel->Geom().SetData(wavedir, numwaves);
       
    }